

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

int __thiscall application::Chat::run(Chat *this)

{
  int iVar1;
  char *pcVar2;
  Chat *pCVar3;
  winsize w;
  wstring temp;
  allocator local_71;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_50;
  wchar_t local_40;
  undefined4 uStack_3c;
  
  local_50._M_allocated_capacity = (size_type)&local_40;
  local_50._8_8_ = 0;
  local_40 = L'\0';
  pCVar3 = (Chat *)&std::wcout;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
            ((wostream *)&std::wcout,(this->prompt_)._M_dataplus._M_p,
             (this->prompt_)._M_string_length);
LAB_0014cd89:
  while( true ) {
    do {
      while( true ) {
        iVar1 = _getwch(pCVar3);
        if (iVar1 < 10) goto LAB_0014ce08;
        if (iVar1 == 10) break;
        if (iVar1 != 0x7f) goto LAB_0014ce19;
        if ((this->input_)._M_string_length != 0) {
          std::__cxx11::wstring::pop_back();
          pCVar3 = (Chat *)0x1;
          ioctl(1,0x5413,(wstring *)local_70);
          pcVar2 = "\b \b";
          if ((this->input_)._M_string_length % (ulong)(ushort)local_70._2_2_ +
              (long)this->promptLastLine_ == (ulong)(ushort)local_70._2_2_) {
            moveCursor(pCVar3,(uint)(ushort)local_70._2_2_,1);
            pcVar2 = " ";
          }
          pCVar3 = (Chat *)&std::wcout;
          std::operator<<((wostream *)&std::wcout,pcVar2);
        }
      }
    } while ((this->input_)._M_string_length == 0);
    std::__cxx11::wstring::_M_assign((wstring *)&local_50);
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mut);
    if (iVar1 != 0) break;
    cleanInput(this);
    (this->input_)._M_string_length = 0;
    *(this->input_)._M_dataplus._M_p = L'\0';
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              ((wostream *)&std::wcout,(this->prompt_)._M_dataplus._M_p,
               (this->prompt_)._M_string_length);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mut);
    std::__cxx11::wstring::wstring
              ((wstring *)local_70,(wchar_t *)local_50._M_allocated_capacity,&local_71);
    sendMessage(this,(wstring *)local_70);
    pCVar3 = (Chat *)CONCAT44(local_70._4_4_,CONCAT22(local_70._2_2_,local_70._0_2_));
    if (pCVar3 != (Chat *)(local_70 + 0x10)) {
      operator_delete(pCVar3,local_70._16_8_ * 4 + 4);
    }
  }
  std::__throw_system_error(iVar1);
LAB_0014cf57:
  std::__throw_bad_function_call();
LAB_0014ce08:
  if (iVar1 != 0) {
    if (iVar1 == 3) {
      if ((this->beforeExiting_).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->beforeExiting_)._M_invoker)((_Any_data *)&this->beforeExiting_);
        if ((wchar_t *)local_50._M_allocated_capacity != &local_40) {
          operator_delete((void *)local_50._M_allocated_capacity,
                          CONCAT44(uStack_3c,local_40) * 4 + 4);
        }
        return 0;
      }
      goto LAB_0014cf57;
    }
LAB_0014ce19:
    if ((iVar1 - 0xa1U < 0xffffffdf && 0x1f < iVar1) && (this->input_)._M_string_length < 0x100) {
      local_70._0_2_ = (undefined2)iVar1;
      local_70._2_2_ = (undefined2)((uint)iVar1 >> 0x10);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                ((wostream *)&std::wcout,(wchar_t *)local_70,1);
      pCVar3 = (Chat *)&this->input_;
      std::__cxx11::wstring::push_back((wchar_t)&this->input_);
    }
  }
  goto LAB_0014cd89;
}

Assistant:

int Chat::run()
{
#ifdef _WIN32
	// for 'case Controls::CTR_V':
	HANDLE hData;
#endif
	int k;
	std::wstring temp;
	wchar_t ch;

	std::wcout << prompt_;

	while (true)
	{
		ch = _getwch();

		switch (ch)
		{
		case Controls::NULL_TERMINATOR:
			continue;
			break;
		case Controls::CTR_C:
			beforeExiting_();
			return 0;
#ifdef _WIN32
		case Controls::CTR_V:
			if (!OpenClipboard(nullptr))
			{
				CloseClipboard();
				break;
			}
			hData = GetClipboardData(CF_UNICODETEXT);
			if (hData == nullptr)
			{
				CloseClipboard();
				break;
			}
			temp = static_cast<wchar_t*>(GlobalLock(hData));
			if (temp.empty())
			{
				CloseClipboard();
				break;
			}
			GlobalUnlock(hData);
			CloseClipboard();

			if (temp.size() + input_.size() > MAX_INPUT_SIZE)
				temp = temp.erase(MAX_INPUT_SIZE - input_.size(), temp.size() - MAX_INPUT_SIZE + input_.size());

			k = 0;
			while (temp.find(L"\r\n", k) != std::string::npos)
			{
				sendMessage(temp.substr(k, temp.find(L"\r\n", k) - k));
				k = temp.find(L"\r\n", k) + 2;
			}

			mut.lock();
			cleanInput();
			// If temp added to input_ before cleanInput(), it removes excessive lines
			input_ += temp.substr(k, temp.find(L"/n") - k);
			std::wcout << prompt_ << input_;
			mut.unlock();
			break;
#endif
		case Controls::BACKSPACE:
			if (input_.size() != 0)
			{
				input_.pop_back();
				int w = getConsoleWidth();
				if (promptLastLine_ + input_.size() % w == w)
				{
#ifdef _WIN32
					moveCursor(w - 1, 1);
					std::wcout << " \b";
					moveCursor(w - 1, 1);
#else
					moveCursor(w, 1);
					std::wcout << " ";
#endif
				}
				else
				{
					std::wcout << "\b \b";
				}
			}
			break;
		case Controls::ENTER:
			// Shipped message comes faster than the end of this case
			// cause this I reset data first and then send the message.
			if (input_.size() == 0)
				break;
			temp = input_;

			mut.lock();
			cleanInput();
			input_.clear();
			std::wcout << prompt_;
			mut.unlock();

			sendMessage(temp.c_str());
			break;
		default:
			if (input_.size() < MAX_INPUT_SIZE && ch > 31 && (ch < 128 || ch > 160))
			{
				std::wcout << ch;
				input_.push_back(ch);
			}
			break;
		}
	}
}